

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O1

FOptionalMapinfoData * __thiscall FEDOptions::Clone(FEDOptions *this)

{
  FEDOptions *this_00;
  
  this_00 = (FEDOptions *)operator_new(0x28);
  FEDOptions(this_00);
  (this_00->super_FOptionalMapinfoData).identifier.Index =
       (this->super_FOptionalMapinfoData).identifier.Index;
  FString::operator=(&this_00->EDName,&this->EDName);
  FString::operator=(&this_00->acsName,&this->acsName);
  return &this_00->super_FOptionalMapinfoData;
}

Assistant:

virtual FOptionalMapinfoData *Clone() const
	{
		FEDOptions *newopt = new FEDOptions;
		newopt->identifier = identifier;
		newopt->EDName = EDName;
		newopt->acsName = acsName;
		return newopt;
	}